

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReader.h
# Opt level: O3

uint64_t __thiscall FileReader::size(FileReader *this)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  posixerror *ppVar4;
  uint64_t devsize;
  stat data;
  string local_d8;
  uint64_t local_b8;
  stat local_b0;
  
  if ((this->super_ReadWriter)._readonly == false) {
    flush(this);
  }
  iVar1 = fileno((FILE *)this->_f);
  iVar2 = fstat(iVar1,&local_b0);
  if (iVar2 == -1) {
    ppVar4 = (posixerror *)__cxa_allocate_exception(0x28);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"fstat","");
    posixerror::posixerror(ppVar4,&local_d8);
    __cxa_throw(ppVar4,&posixerror::typeinfo,posixerror::~posixerror);
  }
  if ((local_b0.st_mode & 0xf000) == 0x6000) {
    iVar1 = ioctl(iVar1,0x80081272,&local_b8);
    if (iVar1 == -1) {
      ppVar4 = (posixerror *)__cxa_allocate_exception(0x28);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"ioctl(BLKGETSIZE64)","");
      posixerror::posixerror(ppVar4,&local_d8);
      __cxa_throw(ppVar4,&posixerror::typeinfo,posixerror::~posixerror);
    }
  }
  else {
    local_b8 = local_b0.st_size;
    if ((local_b0.st_mode & 0xf000) != 0x8000) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = "not a file or blockdev";
      __cxa_throw(puVar3,&char_const*::typeinfo,0);
    }
  }
  return local_b8;
}

Assistant:

virtual uint64_t size()
    {
#ifdef _WIN32_WCE
        throw "file::size not supported under wince";
        flush();

        DWORD fsHigh;
        DWORD fsLow= GetFileSize(fileno(_f), &fsHigh);
        if (fsLow==0xFFFFFFFF && GetLastError())
            throw win32error("GetFileSize");
        return (uint64_t(fsHigh)<<32) | fsLow;
#else
        // if we don't fflush, there may be unwritten bytes in the file buffer
        // which are not counted in the size yet
        if (!isreadonly())
            flush();

        int h= fileno(_f);
        struct stat data;
        if (-1==fstat(h, &data))
            throw posixerror("fstat");
        if (S_ISREG(data.st_mode)) {
            return data.st_size;
        }
#if !defined(_WIN32) && !defined(__FreeBSD__)
        else if (S_ISBLK(data.st_mode)) {
#if TARGET_OS_IPHONE
            throw "block devices not supported on IOS";
#elif defined(__MACH__)
            uint64_t bkcount;
            uint32_t bksize;
            if (-1==ioctl(h, DKIOCGETBLOCKCOUNT, &bkcount))
                throw posixerror("ioctl(DKIOCGETBLOCKCOUNT)");
            if (-1==ioctl(h, DKIOCGETBLOCKSIZE, &bksize))
                throw posixerror("ioctl(DKIOCGETBLOCKSIZE)");
            return bkcount*bksize;
#else
            uint64_t devsize;
            if (-1==ioctl(h, BLKGETSIZE64, &devsize))
                throw posixerror("ioctl(BLKGETSIZE64)");
            return devsize;
#endif
        }
#endif
        else {
            throw "not a file or blockdev";
        }
#endif
    }